

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_zlib.cpp
# Opt level: O3

bool __thiscall
ON_CompressedBuffer::CompressionEnd(ON_CompressedBuffer *this,ON_CompressedBufferHelper *helper)

{
  bool bVar1;
  
  if (helper == (ON_CompressedBufferHelper *)0x0) {
    return false;
  }
  if (helper->m_action == 2) {
    z_inflateEnd(&helper->m_strm);
  }
  else {
    if (helper->m_action != 1) {
      bVar1 = false;
      goto LAB_0068ea00;
    }
    z_deflateEnd(&helper->m_strm);
  }
  bVar1 = true;
LAB_0068ea00:
  (helper->m_strm).opaque = (z_voidpf)0x0;
  (helper->m_strm).data_type = 0;
  (helper->m_strm).adler = 0;
  (helper->m_strm).zalloc = (z_alloc_func)0x0;
  (helper->m_strm).zfree = (z_free_func)0x0;
  (helper->m_strm).msg = (char *)0x0;
  (helper->m_strm).state = (internal_state *)0x0;
  (helper->m_strm).next_out = (z_Bytef *)0x0;
  (helper->m_strm).avail_out = 0;
  (helper->m_strm).total_out = 0;
  (helper->m_strm).next_in = (z_Bytef *)0x0;
  (helper->m_strm).avail_in = 0;
  (helper->m_strm).total_in = 0;
  *(undefined8 *)&(helper->m_strm).reserved = 0;
  helper->m_action = 0;
  return bVar1;
}

Assistant:

bool ON_CompressedBuffer::CompressionEnd( struct ON_CompressedBufferHelper* helper ) const
{
  bool rc = false;

  if ( helper )
  {
    // inflateEnd() and deflateEnd() are in zlib 1.3.3
    if (1 == helper->m_action)
    {
      // finish compression
      deflateEnd(&helper->m_strm);
      rc = true;
    }
    else if (2 == helper->m_action)
    {
      // finish decompression
      inflateEnd(&helper->m_strm);
      rc = true;
    }
    memset(&helper->m_strm, 0, sizeof(helper->m_strm));
    helper->m_action = 0;
  }

  return rc;
}